

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Chassis::RS_Chassis
          (RS_Chassis *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  ChColor local_78c;
  ChVector<double> local_780;
  ChQuaternion<double> local_768;
  ChVector<double> local_748;
  CylinderShape local_730;
  ChQuaternion<double> local_6e8;
  ChVector<double> local_6c8;
  CylinderShape local_6b0;
  ChQuaternion<double> local_668;
  ChVector<double> local_648;
  CylinderShape local_630;
  ChQuaternion<double> local_5e8;
  ChVector<double> local_5c8;
  CylinderShape local_5b0;
  ChQuaternion<double> local_568;
  ChQuaternion<double> local_548;
  ChQuaternion<double> local_528;
  ChVector<double> local_508;
  CylinderShape local_4f0;
  ChVector<double> local_4a8;
  ChQuaternion<double> local_490;
  ChVector<double> local_470;
  BoxShape local_458;
  ChVector<double> local_408;
  ChQuaternion<double> local_3f0;
  ChVector<double> local_3d0;
  BoxShape local_3b8;
  ChVector<double> local_368;
  ChQuaternion<double> local_350;
  ChVector<double> local_330;
  BoxShape local_318;
  ChVector<double> local_2c8;
  ChQuaternion<double> local_2b0;
  ChVector<double> local_290;
  BoxShape local_278;
  ChVector<double> local_228;
  BoxShape local_210;
  ChVector<double> local_1c0;
  BoxShape local_1a8;
  shared_ptr<chrono::ChPhysicsItem> local_158;
  ChQuaternion<double> local_148;
  ChFrame<double> local_128;
  undefined1 local_a0 [8];
  ChVector<double> inertia_xy;
  ChVector<double> inertia_xx;
  ChVector<double> com;
  double mass;
  shared_ptr<chrono::ChMaterialSurface> local_40;
  ChSystem *local_30;
  ChSystem *system_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *psStack_18;
  bool fixed_local;
  string *name_local;
  RS_Chassis *this_local;
  
  local_30 = system;
  system_local = (ChSystem *)mat;
  mat_local._7_1_ = fixed;
  psStack_18 = name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_40,mat);
  RS_Part::RS_Part(&this->super_RS_Part,name,&local_40,local_30);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_40);
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Chassis_002ed8a0;
  (this->super_RS_Part).field_0xec = 0;
  ChVector<double>::ChVector
            ((ChVector<double> *)(inertia_xx.m_data + 2),0.040288,-0.001937,-0.073574);
  ChVector<double>::ChVector((ChVector<double> *)(inertia_xy.m_data + 2),1.272134,2.568776,3.086984)
  ;
  ChVector<double>::ChVector((ChVector<double> *)local_a0,0.00889,-0.13942,0.000325);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChObj::SetIdentifier((ChObj *)peVar2,0);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChBody::SetMass((ChBody *)peVar2,46.658335);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChQuaternion<double>::ChQuaternion(&local_148,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&local_128,(ChVector<double> *)(inertia_xx.m_data + 2),&local_148);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF((ChFrame *)peVar2);
  ChFrame<double>::~ChFrame(&local_128);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetInertiaXX(peVar2);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetInertiaXY(peVar2);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetBodyFixed(SUB81(peVar2,0));
  pCVar1 = local_30;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBodyAuxRef,void>
            (&local_158,&(this->super_RS_Part).m_body);
  chrono::ChSystem::Add(pCVar1,&local_158);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_158);
  ChVector<double>::ChVector(&local_1c0,0.257,0.5,0.238);
  BoxShape::BoxShape(&local_1a8,(ChVector<double> *)&VNULL,(ChQuaternion<double> *)&QUNIT,&local_1c0
                    );
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  push_back(&(this->super_RS_Part).m_boxes,&local_1a8);
  ChVector<double>::ChVector(&local_228,0.93,0.23,0.238);
  BoxShape::BoxShape(&local_210,(ChVector<double> *)&VNULL,(ChQuaternion<double> *)&QUNIT,&local_228
                    );
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  push_back(&(this->super_RS_Part).m_boxes,&local_210);
  ChVector<double>::ChVector(&local_290,0.25393,0.075769,0.0);
  chrono::Q_from_AngZ(-0.38153);
  ChVector<double>::ChVector(&local_2c8,0.36257,0.23,0.238);
  BoxShape::BoxShape(&local_278,&local_290,&local_2b0,&local_2c8);
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  push_back(&(this->super_RS_Part).m_boxes,&local_278);
  ChVector<double>::ChVector(&local_330,-0.25393,0.075769,0.0);
  chrono::Q_from_AngZ(0.38153);
  ChVector<double>::ChVector(&local_368,0.36257,0.23,0.238);
  BoxShape::BoxShape(&local_318,&local_330,&local_350,&local_368);
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  push_back(&(this->super_RS_Part).m_boxes,&local_318);
  ChVector<double>::ChVector(&local_3d0,0.25393,-0.075769,0.0);
  chrono::Q_from_AngZ(0.38153);
  ChVector<double>::ChVector(&local_408,0.36257,0.23,0.238);
  BoxShape::BoxShape(&local_3b8,&local_3d0,&local_3f0,&local_408);
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  push_back(&(this->super_RS_Part).m_boxes,&local_3b8);
  ChVector<double>::ChVector(&local_470,-0.25393,-0.075769,0.0);
  chrono::Q_from_AngZ(-0.38153);
  ChVector<double>::ChVector(&local_4a8,0.36257,0.23,0.238);
  BoxShape::BoxShape(&local_458,&local_470,&local_490,&local_4a8);
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  push_back(&(this->super_RS_Part).m_boxes,&local_458);
  ChVector<double>::ChVector(&local_508,0.41705,0.0,-0.15864);
  chrono::Q_from_AngZ(1.5707963267948966);
  chrono::Q_from_AngX(1.1868243267948966);
  ChQuaternion<double>::operator*(&local_528,&local_548,&local_568);
  CylinderShape::CylinderShape(&local_4f0,&local_508,&local_528,0.05,0.144);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::push_back(&(this->super_RS_Part).m_cylinders,&local_4f0);
  ChVector<double>::ChVector(&local_5c8,0.29326,0.2094,0.011499999999999996);
  chrono::Q_from_AngX(1.5707963267948966);
  CylinderShape::CylinderShape(&local_5b0,&local_5c8,&local_5e8,0.05,0.145);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::push_back(&(this->super_RS_Part).m_cylinders,&local_5b0);
  ChVector<double>::ChVector(&local_648,-0.29326,0.2094,0.011499999999999996);
  chrono::Q_from_AngX(1.5707963267948966);
  CylinderShape::CylinderShape(&local_630,&local_648,&local_668,0.05,0.145);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::push_back(&(this->super_RS_Part).m_cylinders,&local_630);
  ChVector<double>::ChVector(&local_6c8,-0.29326,-0.2094,0.011499999999999996);
  chrono::Q_from_AngX(1.5707963267948966);
  CylinderShape::CylinderShape(&local_6b0,&local_6c8,&local_6e8,0.05,0.145);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::push_back(&(this->super_RS_Part).m_cylinders,&local_6b0);
  ChVector<double>::ChVector(&local_748,0.29326,-0.2094,0.011499999999999996);
  chrono::Q_from_AngX(1.5707963267948966);
  CylinderShape::CylinderShape(&local_730,&local_748,&local_768,0.05,0.145);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::push_back(&(this->super_RS_Part).m_cylinders,&local_730);
  std::__cxx11::string::operator=((string *)&(this->super_RS_Part).m_mesh_name,"robosim_chassis");
  ChVector<double>::ChVector(&local_780,0.0,0.0,0.0);
  ChVector<double>::operator=(&(this->super_RS_Part).m_offset,&local_780);
  ChColor::ChColor(&local_78c,0.4,0.4,0.7);
  ChColor::operator=(&(this->super_RS_Part).m_color,&local_78c);
  return;
}

Assistant:

RS_Chassis::RS_Chassis(const std::string& name, bool fixed, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system), m_collide(false) {
    double mass = 46.658335;
    ChVector<> com(0.040288, -0.001937, -0.073574);
    ChVector<> inertia_xx(1.272134, 2.568776, 3.086984);
    ChVector<> inertia_xy(0.008890, -0.13942, 0.000325);

    m_body->SetIdentifier(0);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    m_body->SetBodyFixed(fixed);
    system->Add(m_body);

    // Create the set of primitive shapes
    m_boxes.push_back(BoxShape(VNULL, QUNIT, ChVector<>(0.257, 0.50, 0.238)));
    m_boxes.push_back(BoxShape(VNULL, QUNIT, ChVector<>(0.93, 0.230, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(+0.25393, +0.075769, 0), Q_from_AngZ(-0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(-0.25393, +0.075769, 0), Q_from_AngZ(+0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(+0.25393, -0.075769, 0), Q_from_AngZ(+0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(-0.25393, -0.075769, 0), Q_from_AngZ(-0.38153), ChVector<>(0.36257, 0.23, 0.238)));

    m_cylinders.push_back(CylinderShape(ChVector<>(0.417050, 0, -0.158640),
                                        Q_from_AngZ(CH_C_PI_2) * Q_from_AngX(CH_C_PI_2 - 0.383972), 0.05, 0.144));

    // Geometry for link0 (all limbs); these links are fixed to the chassis
    m_cylinders.push_back(
        CylinderShape(ChVector<>(+0.29326, +0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(-0.29326, +0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(-0.29326, -0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(+0.29326, -0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));

    // Set the name of the visualization mesh
    m_mesh_name = "robosim_chassis";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
}